

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O1

void __thiscall
wasm::GenerateDynCalls::generateDynCallThunk(GenerateDynCalls *this,HeapType funcType)

{
  pointer *ppNVar1;
  undefined8 *puVar2;
  pointer pNVar3;
  Module *this_00;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> _Var4;
  uintptr_t uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  Type *pTVar10;
  Type *pTVar11;
  undefined8 *puVar12;
  Function *pFVar13;
  Export *pEVar14;
  IString *pIVar15;
  Table *pTVar16;
  CallIndirect *pCVar17;
  undefined1 reuse;
  undefined8 in_RCX;
  Type params_00;
  ulong uVar18;
  pointer __args;
  int iVar19;
  pointer pNVar20;
  uint __len;
  uint __val;
  Type *__range1;
  bool bVar21;
  Signature sig_00;
  string_view sVar22;
  IString IVar23;
  string_view sVar24;
  Name name;
  undefined1 auStack_278 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  HeapType local_f0;
  HeapType funcType_local;
  Type local_e0;
  Expression *local_d8;
  Expression *local_d0;
  Builder local_c8;
  Builder builder;
  undefined1 local_b8 [8];
  Signature sig;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  undefined1 local_88 [8];
  Iterator __begin1_1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> f;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *local_68;
  undefined1 auStack_58 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedParams;
  
  local_f0.id = funcType.id;
  _local_b8 = (Expression)HeapType::getSignature(&local_f0);
  bVar21 = local_b8._8_8_.id < 7;
  params_00.id = CONCAT71((int7)((ulong)in_RCX >> 8),bVar21);
  if (((undefined1  [16])_local_b8 & (undefined1  [16])0x1) != (undefined1  [16])0x0 && !bVar21) {
    Fatal::Fatal((Fatal *)auStack_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
               "GenerateDynCalls: Cannot operate on multiple return values:",0x3b);
    Fatal::operator<<((Fatal *)auStack_278,&sig.params);
    Fatal::~Fatal((Fatal *)auStack_278);
  }
  if (this->onlyI64 == true) {
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _auStack_278 = _local_b8;
    auStack_58 = (undefined1  [8])&args;
    sVar9 = wasm::Type::size((Type *)&args);
    params_00.id = (ulong)auStack_58 ^ (ulong)&args |
                   (ulong)namedParams.
                          super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                          _M_impl.super__Vector_impl_data._M_start ^ sVar9;
    bVar21 = params_00.id == 0;
    if (!bVar21) {
      pTVar10 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      if (pTVar10->id != 3) {
        do {
          namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&((namedParams.
                                  super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name).super_IString.
                                str._M_len + 1);
          params_00.id = (ulong)namedParams.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_start ^ sVar9;
          bVar21 = auStack_58 == (undefined1  [8])&args && params_00.id == 0;
          if (bVar21) goto LAB_00873328;
          pTVar10 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
        } while (pTVar10->id != 3);
      }
      if (!bVar21) goto LAB_008733a5;
    }
LAB_00873328:
    pTVar10 = (Type *)auStack_278;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_58 = (undefined1  [8])pTVar10;
    sVar9 = wasm::Type::size(pTVar10);
    params_00.id = (ulong)auStack_58 ^ (ulong)pTVar10 |
                   (ulong)namedParams.
                          super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                          _M_impl.super__Vector_impl_data._M_start ^ sVar9;
    bVar21 = params_00.id != 0;
    if ((bVar21) &&
       (pTVar11 = wasm::Type::Iterator::operator*((Iterator *)auStack_58), pTVar11->id != 3)) {
      do {
        namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)&((namedParams.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                              _M_len + 1);
        params_00.id = (ulong)namedParams.
                              super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                              _M_impl.super__Vector_impl_data._M_start ^ sVar9;
        bVar21 = auStack_58 != (undefined1  [8])pTVar10 || params_00.id != 0;
        if (auStack_58 == (undefined1  [8])pTVar10 && params_00.id == 0) break;
        pTVar11 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      } while (pTVar11->id != 3);
    }
    if (!bVar21) {
      return;
    }
  }
LAB_008733a5:
  this_00 = (this->
            super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
            ).super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
            .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
            currModule;
  ppNVar1 = &namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_c8.wasm = this_00;
  auStack_58 = (undefined1  [8])ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"dynCall_","");
  getSig_abi_cxx11_((string *)&sig.results,(wasm *)sig.params.id,(Type)local_b8,params_00);
  pNVar3 = (pointer)((long)&((namedParams.
                              super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                              _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                            _M_len +
                    (long)&(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start)->id);
  pNVar20 = (pointer)0xf;
  if (auStack_58 != (undefined1  [8])ppNVar1) {
    pNVar20 = namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pNVar20 < pNVar3) {
    pNVar20 = (pointer)0xf;
    if ((pointer *)sig.results.id !=
        &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      pNVar20 = (pointer)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    if (pNVar3 <= pNVar20) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&sig.results,0,(char *)0x0,(ulong)auStack_58);
      goto LAB_00873456;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append(auStack_58,sig.results.id);
LAB_00873456:
  auStack_278 = (undefined1  [8])
                &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = puVar12 + 2;
  if ((pointer *)*puVar12 == (pointer *)puVar2) {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puVar12[3];
  }
  else {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    auStack_278 = (undefined1  [8])*puVar12;
  }
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar12[1];
  *puVar12 = puVar2;
  puVar12[1] = 0;
  *(undefined1 *)puVar2 = 0;
  sVar22._M_str = (char *)0x0;
  sVar22._M_len = (size_t)auStack_278;
  sVar22 = IString::interned((IString *)
                             args.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,sVar22,SUB81(puVar2,0));
  if (auStack_278 !=
      (undefined1  [8])
      &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_278,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if ((pointer *)sig.results.id !=
      &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)sig.results.id,
                    (ulong)((long)&(params.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  if (auStack_58 != (undefined1  [8])ppNVar1) {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&((namedParams.
                                     super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->name).
                                   super_IString.str._M_len + 1));
  }
  pFVar13 = Module::getFunctionOrNull(this_00,(Name)sVar22);
  if ((pFVar13 == (Function *)0x0) &&
     (pEVar14 = Module::getExportOrNull(this_00,(Name)sVar22), pEVar14 == (Export *)0x0)) {
    auStack_58 = (undefined1  [8])0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.results.id = 0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if ((this_00->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      IVar23.str = (string_view)Name::fromInt(0);
      pIVar15 = (IString *)operator_new(0x58);
      pIVar15[4].str._M_len = 0;
      *(char **)((long)(pIVar15 + 4) + 8) = (char *)0x0;
      pIVar15[3].str._M_len = 0;
      *(char **)((long)(pIVar15 + 3) + 8) = (char *)0x0;
      pIVar15[2].str._M_len = 0;
      *(char **)((long)(pIVar15 + 2) + 8) = (char *)0x0;
      pIVar15[1].str._M_len = 0;
      *(char **)((long)(pIVar15 + 1) + 8) = (char *)0x0;
      (pIVar15->str)._M_len = 0;
      *(char **)((long)&pIVar15->str + 8) = (char *)0x0;
      reuse = 0xff;
      pIVar15[4].str._M_len = 0xffffffff;
      *(char **)((long)(pIVar15 + 4) + 8) = (char *)0x2;
      pIVar15[5].str._M_len = 0x12;
      auStack_278 = (undefined1  [8])pIVar15;
      pIVar15->str = IVar23.str;
      pIVar15[5].str._M_len = 0x12;
      *(char **)((long)(pIVar15 + 4) + 8) = (char *)0x2;
      *(char **)((long)(pIVar15 + 3) + 8) = (char *)0x0;
      pIVar15[4].str._M_len = 0xffffffff;
      pTVar16 = Module::addTable(this_00,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
                                          *)auStack_278);
      if ((__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)auStack_278 !=
          (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)0x0) {
        operator_delete((void *)auStack_278,0x58);
      }
      pcVar6 = DAT_010d1118;
      (pTVar16->super_Importable).module.super_IString.str._M_len = ENV;
      (pTVar16->super_Importable).module.super_IString.str._M_str = pcVar6;
      sVar24 = IString::interned((IString *)&DAT_00000019,(string_view)ZEXT816(0xdd8921),(bool)reuse
                                );
      (pTVar16->super_Importable).base.super_IString.str = sVar24;
      (pTVar16->addressType).id =
           *(uintptr_t *)
            ((long)(((this_00->memories).
                     super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t +
            0x50);
    }
    builder.wasm = (Module *)
                   (this_00->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<char_const(&)[5],wasm::Type&>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_58,
               (char (*) [5])"fptr",
               &((_Head_base<0UL,_wasm::Table_*,_false> *)
                &((builder.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl->addressType);
    __args = ((builder.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 9;
    if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,
                 (iterator)
                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,(Type *)__args);
    }
    else {
      (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id =
           (uintptr_t)
           (__args->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_88 = (undefined1  [8])local_b8;
    pTVar10 = (Type *)wasm::Type::size((Type *)local_b8);
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar10) || (local_88 != (undefined1  [8])local_b8)) {
      __val = 0;
      do {
        pTVar11 = wasm::Type::Iterator::operator*((Iterator *)local_88);
        __len = 1;
        if (9 < __val) {
          uVar18 = (ulong)__val;
          uVar7 = 4;
          do {
            __len = uVar7;
            uVar8 = (uint)uVar18;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_00873753;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_00873753;
            }
            if (uVar8 < 10000) goto LAB_00873753;
            uVar18 = uVar18 / 10000;
            uVar7 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_00873753:
        auStack_278 = (undefined1  [8])
                      &args.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct((ulong)auStack_278,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)auStack_278,__len,__val);
        std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
        emplace_back<std::__cxx11::string,wasm::Type_const&>
                  ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_278,
                   pTVar11);
        if (auStack_278 !=
            (undefined1  [8])
            &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)auStack_278,
                          (long)args.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
        }
        if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,
                     (iterator)
                     params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,pTVar11);
        }
        else {
          (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = pTVar11->id;
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __val = __val + 1;
        __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                parent != pTVar10) || (local_88 != (undefined1  [8])local_b8));
    }
    wasm::Type::Type(&local_e0,(Tuple *)&sig.results);
    sig_00.results.id = sig.params.id;
    sig_00.params.id = local_e0.id;
    HeapType::HeapType(&funcType_local,sig_00);
    _auStack_278 = (Expression)ZEXT816(0);
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         sVar22._M_len;
    local_68 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)sVar22._M_str;
    name.super_IString.str._M_str =
         (char *)f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    name.super_IString.str._M_len =
         (size_t)&__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  index;
    Builder::makeFunction
              (name,local_68,(HeapType)auStack_58,
               (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)funcType_local.id,
               (Expression *)auStack_278);
    if ((__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)auStack_278 !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)0x0) {
      operator_delete((void *)auStack_278,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_278);
    }
    *(undefined1 *)
     (__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x10) =
         1;
    _Var4.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         ((builder.wasm)->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
    local_d0 = (Expression *)MixedArena::allocSpace(&(local_c8.wasm)->allocator,0x18,8);
    local_d0->_id = LocalGetId;
    *(undefined4 *)(local_d0 + 1) = 0;
    (local_d0->type).id =
         (uintptr_t)
         _Var4.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _auStack_278 = (Expression)ZEXT816(0);
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_88 = (undefined1  [8])local_b8;
    pTVar10 = (Type *)wasm::Type::size((Type *)local_b8);
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar10) || (local_88 != (undefined1  [8])local_b8)) {
      iVar19 = 1;
      do {
        do {
          pTVar11 = wasm::Type::Iterator::operator*((Iterator *)local_88);
          uVar5 = pTVar11->id;
          local_d8 = (Expression *)MixedArena::allocSpace(&(local_c8.wasm)->allocator,0x18,8);
          local_d8->_id = LocalGetId;
          *(int *)(local_d8 + 1) = iVar19;
          (local_d8->type).id = uVar5;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_278,
                     &local_d8);
          __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
          iVar19 = iVar19 + 1;
        } while (__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                 parent != pTVar10);
      } while (local_88 != (undefined1  [8])local_b8);
    }
    pCVar17 = Builder::
              makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        (&local_c8,
                         (IString)*(IString *)
                                   &(((builder.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t,local_d0,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_278,local_f0,false);
    *(CallIndirect **)
     (__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x60) =
         pCVar17;
    Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                                &__begin1_1.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index);
    pFVar13 = Module::getFunctionOrNull(this_00,(Name)sVar22);
    if (pFVar13 == (Function *)0x0) {
      __assert_fail("!must_export",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GenerateDynCalls.cpp"
                    ,0x6b,"void wasm::exportFunction(Module &, Name, bool)");
    }
    pEVar14 = Module::getExportOrNull(this_00,(Name)sVar22);
    if (pEVar14 == (Export *)0x0) {
      pEVar14 = (Export *)operator_new(0x30);
      (pEVar14->name).super_IString.str._M_len =
           (size_t)f._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      (pEVar14->name).super_IString.str._M_str = (char *)local_68;
      pEVar14->kind = Function;
      *(__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
       &(pEVar14->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
        super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u =
           f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      *(vector<wasm::NameType,_std::allocator<wasm::NameType>_> **)
       ((long)&(pEVar14->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 8) = local_68;
      *(__index_type *)
       ((long)&(pEVar14->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = '\0';
      Module::addExport(this_00,pEVar14);
    }
    if ((__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)auStack_278 !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)0x0) {
      operator_delete((void *)auStack_278,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_278);
    }
    if (__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)
                 &__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  index,(Function *)
                        __begin1_1.
                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    }
    if (sig.results.id != 0) {
      operator_delete((void *)sig.results.id,
                      (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - sig.results.id);
    }
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)namedParams.
                            super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return;
}

Assistant:

void GenerateDynCalls::generateDynCallThunk(HeapType funcType) {
  Signature sig = funcType.getSignature();

  if (sig.results.isTuple()) {
    // Emscripten output is assumed to be MVP, and not to have multiple return
    // values. In particular, signatures in Emscripten all look like "abcd"
    // where "a" is the single return value, and "bcd" are the (in this case
    // three) parameters.
    Fatal() << "GenerateDynCalls: Cannot operate on multiple return values:"
            << sig.results;
  }

  if (onlyI64 && !hasI64(sig)) {
    return;
  }

  Module* wasm = getModule();
  Builder builder(*wasm);
  Name name = std::string("dynCall_") + getSig(sig.results, sig.params);
  if (wasm->getFunctionOrNull(name) || wasm->getExportOrNull(name)) {
    return; // module already contains this dyncall
  }
  std::vector<NameType> namedParams;
  std::vector<Type> params;
  if (wasm->tables.empty()) {
    // Add an imported table in exactly the same manner as the LLVM wasm backend
    // would add one.
    auto* table = wasm->addTable(Builder::makeTable(Name::fromInt(0)));
    table->module = ENV;
    table->base = "__indirect_function_table";
    table->addressType = wasm->memories[0]->addressType;
  }
  auto& table = wasm->tables[0];
  namedParams.emplace_back("fptr",
                           table->addressType); // function pointer param
  params.push_back(table->addressType);
  int p = 0;
  for (const auto& param : sig.params) {
    namedParams.emplace_back(std::to_string(p++), param);
    params.push_back(param);
  }
  auto f = builder.makeFunction(
    name, std::move(namedParams), Signature(Type(params), sig.results), {});
  f->hasExplicitName = true;
  Expression* fptr = builder.makeLocalGet(0, table->addressType);
  std::vector<Expression*> args;
  Index i = 0;
  for (const auto& param : sig.params) {
    args.push_back(builder.makeLocalGet(++i, param));
  }
  f->body = builder.makeCallIndirect(table->name, fptr, args, funcType);

  wasm->addFunction(std::move(f));
  exportFunction(*wasm, name, true);
}